

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

Object * executeBlock(Object *__return_storage_ptr__,Block b,Environment *env)

{
  Object local_68;
  int local_24;
  Environment *pEStack_20;
  int num;
  Environment *env_local;
  Block b_local;
  
  b_local._0_8_ = b.statements;
  env_local = b._0_8_;
  local_24 = 0;
  pEStack_20 = env;
  memcpy(__return_storage_ptr__,&nullObject,0x40);
  while( true ) {
    if ((int)env_local <= local_24) {
      return __return_storage_ptr__;
    }
    executeStatement(&local_68,*(Statement *)(b_local._0_8_ + (long)local_24 * 0x40),pEStack_20);
    memcpy(__return_storage_ptr__,&local_68,0x40);
    if (brk != 0) break;
    if (ret != 0) {
      return __return_storage_ptr__;
    }
    local_24 = local_24 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static Object executeBlock(Block b, Environment *env){
    //debug("Executing block statement");
    int num = 0;
    Object retl = nullObject;
    while(num < b.numStatements){
        retl = executeStatement(b.statements[num], env);
        if(brk || ret)
            break;
        num++;
    }
    return retl;
}